

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse_fasta_diff.cpp
# Opt level: O1

void __thiscall argparse::args_t::args_t(args_t *this,int argc,char **argv)

{
  char *__s1;
  char *str;
  int iVar1;
  FILE *pFVar2;
  int iVar3;
  char *__s1_00;
  char *__s1_01;
  
  this->input_master = (FILE *)0x0;
  this->input_add = _stdin;
  this->output = (FILE *)_stdout;
  this->op = add;
  this->checks = id;
  this->quiet = false;
  if (1 < argc) {
    iVar3 = 1;
    do {
      str = argv[iVar3];
      if (*str != '-') {
        if (iVar3 == argc + -1) {
          parse_input_add(this,str);
          goto LAB_001095d6;
        }
LAB_001095c5:
        ERROR("unknown argument: %s",str);
        goto LAB_001095d6;
      }
      if (str[1] == '-') {
        __s1_01 = str + 2;
        __s1_00 = "help";
        iVar1 = strcmp(__s1_01,"help");
        if (iVar1 == 0) {
          argparse::args_t();
          goto LAB_00109685;
        }
        goto LAB_001095c5;
      }
      __s1 = str + 1;
      __s1_00 = "h";
      __s1_01 = __s1;
      iVar1 = strcmp(__s1,"h");
      if (iVar1 == 0) {
LAB_00109685:
        argparse::args_t();
        pFVar2 = _stdout;
        if ((__s1_00 != (char *)0x0) && (iVar3 = strcmp(__s1_00,"-"), pFVar2 = _stdout, iVar3 != 0))
        {
          pFVar2 = fopen(__s1_00,"wb");
        }
        *(FILE **)(__s1_01 + 0x10) = pFVar2;
        if (pFVar2 == (FILE *)0x0) {
          ERROR("failed to open the OUTPUT file %s",__s1_00);
          return;
        }
        return;
      }
      switch(*__s1) {
      case 'm':
        if (iVar3 + 1 == argc) {
          ERROR("ran out of command line arguments");
        }
        parse_input_master(this,argv[iVar3 + 1]);
        break;
      default:
        ERROR("unknown argument: %s",str);
        goto LAB_001095d6;
      case 'o':
        if (iVar3 + 1 == argc) {
          ERROR("ran out of command line arguments");
        }
        parse_output(this,argv[iVar3 + 1]);
        break;
      case 'p':
        if (iVar3 + 1 == argc) {
          ERROR("ran out of command line arguments");
        }
        parse_file_operation(this,argv[iVar3 + 1]);
        break;
      case 'q':
        this->quiet = true;
        goto LAB_001095d6;
      case 't':
        if (iVar3 + 1 == argc) {
          ERROR("ran out of command line arguments");
        }
        parse_match_mode(this,argv[iVar3 + 1]);
      }
      iVar3 = iVar3 + 1;
LAB_001095d6:
      iVar3 = iVar3 + 1;
    } while (iVar3 < argc);
  }
  if (this->input_master == (FILE *)0x0) {
    ERROR("Required argument MASTER FILE was not provided");
    return;
  }
  return;
}

Assistant:

args_t::args_t( int argc, const char * argv[] ) :
    input_master (NULL),
    input_add( stdin ),
    output( stdout ),
    op ( DEFAULT_OPERATION ),
    checks ( DEFAULT_MATCH ),
    quiet (false)
    {
        // skip arg[0], it's just the program name
        for (int i = 1; i < argc; ++i ) {
            const char * arg = argv[i];
            
            if ( arg[0] == '-' && arg[1] == '-' ) {
                if ( !strcmp( &arg[2], "help" ) ) help();
                else
                    ERROR( "unknown argument: %s", arg );
            }
            else if ( arg[0] == '-' ) {
                if ( !strcmp( &arg[1], "h" ) ) help();
                else if (  arg[1] == 'o' ) parse_output( next_arg (i, argc, argv) );
                else if (  arg[1] == 'm')  parse_input_master( next_arg (i, argc, argv) );
                else if (  arg[1] == 'p')  parse_file_operation ( next_arg (i, argc, argv) );
                else if (  arg[1] == 't')  parse_match_mode( next_arg (i, argc, argv) );
                else if (  arg[1] == 'q')  parse_quiet ( );
                else
                    ERROR( "unknown argument: %s", arg );
            }
            else
                if (i == argc-1) {
                    parse_input_add (arg);
                } else {
                    ERROR( "unknown argument: %s", arg );
                }
        }
        
        if (input_master == NULL) {
            ERROR ("Required argument MASTER FILE was not provided");
        }
    }